

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupOnItemClick(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  uint in_ESI;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiID id;
  int mouse_button;
  ImGuiWindow *window;
  ImGuiPopupFlags in_stack_00000030;
  ImGuiID in_stack_00000034;
  ImGuiHoveredFlags in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = IsMouseReleased(in_ESI & 0x1f);
  if ((bVar1) && (bVar1 = IsItemHovered(in_stack_ffffffffffffffe0), bVar1)) {
    if (in_RDI != (char *)0x0) {
      ImGuiWindow::GetID(unaff_retaddr,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    OpenPopupEx(in_stack_00000034,in_stack_00000030);
  }
  return;
}

Assistant:

void ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
    }
}